

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

int64 __thiscall
libmatroska::KaxInternalBlock::GetDataPosition(KaxInternalBlock *this,size_t FrameNumber)

{
  pointer piVar1;
  uint64 uVar2;
  size_t sVar3;
  
  uVar2 = 0xffffffffffffffff;
  if (((this->super_EbmlBinary).super_EbmlElement.bValueIsSet == true) &&
     (piVar1 = (this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     FrameNumber <
     (ulong)((long)(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2))) {
    uVar2 = this->FirstFrameLocation;
    for (sVar3 = 0; FrameNumber != sVar3; sVar3 = sVar3 + 1) {
      uVar2 = uVar2 + (long)piVar1[sVar3];
    }
  }
  return uVar2;
}

Assistant:

int64 KaxInternalBlock::GetDataPosition(size_t FrameNumber)
{
  int64 _Result = -1;

  if (ValueIsSet() && FrameNumber < SizeList.size()) {
    _Result = FirstFrameLocation;

    size_t _Idx = 0;
    while(FrameNumber--) {
      _Result += SizeList[_Idx++];
    }
  }

  return _Result;
}